

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall asl::Socket_::skip(Socket_ *this,int n)

{
  uchar *in_RAX;
  ByteArray a;
  Array<unsigned_char> local_18;
  
  local_18._a = in_RAX;
  Array<unsigned_char>::alloc(&local_18,n);
  (*(this->super_SmartObject_)._vptr_SmartObject_[0xd])
            (this,local_18._a,(ulong)*(uint *)(local_18._a + -0x10));
  Array<unsigned_char>::~Array(&local_18);
  return;
}

Assistant:

void Socket_::skip(int n)
{
	ByteArray a(n);
	read(a.data(), a.length());
}